

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_Float_Test::TestBody(PrintfTest_Float_Test *this)

{
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  string_view format_12;
  string_view format_13;
  string_view format_14;
  string_view format_15;
  string_view format_16;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  char buffer [256];
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char (*in_stack_fffffffffffff468) [9];
  undefined7 in_stack_fffffffffffff470;
  undefined1 in_stack_fffffffffffff477;
  char (*in_stack_fffffffffffff478) [256];
  char (*expected) [256];
  char *in_stack_fffffffffffff480;
  string *actual_expression;
  char *in_stack_fffffffffffff488;
  int line;
  undefined7 in_stack_fffffffffffff490;
  undefined1 in_stack_fffffffffffff497;
  undefined8 in_stack_fffffffffffff498;
  Type TVar5;
  char *format_17;
  AssertHelper *in_stack_fffffffffffff4a0;
  AssertHelper *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4a8;
  undefined7 in_stack_fffffffffffff4b0;
  undefined1 in_stack_fffffffffffff4b7;
  size_t in_stack_fffffffffffff4b8;
  Message *in_stack_fffffffffffff4e8;
  undefined7 in_stack_fffffffffffff4f0;
  undefined1 in_stack_fffffffffffff4f7;
  string local_8e0 [32];
  AssertionResult local_8c0 [2];
  undefined8 local_8a0;
  AssertHelper local_898 [4];
  AssertionResult local_878 [2];
  undefined8 local_858;
  string local_840 [32];
  string local_820 [32];
  AssertionResult local_800 [2];
  undefined8 local_7e0;
  string local_7c8 [32];
  AssertionResult local_7a8 [2];
  undefined8 local_788;
  string local_770 [32];
  string local_750 [32];
  AssertionResult local_730 [2];
  undefined8 local_710;
  string local_6f8 [32];
  AssertionResult local_6d8 [2];
  undefined8 local_6b8;
  string local_6a0 [32];
  string local_680 [32];
  AssertionResult local_660 [2];
  undefined8 local_640;
  string local_628 [32];
  AssertionResult local_608 [2];
  undefined8 local_5e8;
  string local_5d0 [32];
  string local_5b0 [32];
  AssertionResult local_590 [2];
  undefined8 local_570;
  string local_558 [32];
  AssertionResult local_538;
  char local_528 [272];
  undefined8 local_418;
  string local_400 [32];
  string local_3e0 [32];
  AssertionResult local_3c0 [2];
  undefined8 local_3a0;
  string local_388 [32];
  AssertionResult local_368 [2];
  undefined8 local_348;
  string local_330 [32];
  string local_310 [32];
  AssertionResult local_2f0 [2];
  undefined8 local_2d0;
  string local_2b8 [32];
  AssertionResult local_298 [2];
  undefined8 local_278;
  string local_260 [32];
  string local_240 [32];
  AssertionResult local_220 [2];
  undefined8 local_200;
  string local_1e8 [32];
  AssertionResult local_1c8 [2];
  undefined8 local_1a8;
  string local_190 [32];
  string local_170 [32];
  AssertionResult local_150 [2];
  undefined8 local_130;
  string local_118 [32];
  AssertionResult local_f8 [2];
  undefined8 local_d8;
  string local_c0 [32];
  string local_a0 [32];
  AssertionResult local_80 [3];
  undefined8 local_50;
  string local_38 [32];
  AssertionResult local_18;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffff498 >> 0x20);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  local_50 = 0x40788a6666666666;
  format.data_._7_1_ = in_stack_fffffffffffff477;
  format.data_._0_7_ = in_stack_fffffffffffff470;
  format.size_ = (size_t)in_stack_fffffffffffff478;
  test_sprintf<double>(format,(double *)in_stack_fffffffffffff468);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [11])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               (char (*) [3])in_stack_fffffffffffff468);
    testing::AssertionResult::failure_message((AssertionResult *)0x12ea7a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x12eadd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12eb35);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  format_08.data_._7_1_ = in_stack_fffffffffffff4b7;
  format_08.data_._0_7_ = in_stack_fffffffffffff4b0;
  format_08.size_ = in_stack_fffffffffffff4b8;
  make_positional_abi_cxx11_(format_08);
  local_d8 = 0x40788a6666666666;
  fmt::v5::sprintf<std::__cxx11::string,double>
            (in_stack_fffffffffffff4a8,(double *)in_stack_fffffffffffff4a0);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [11])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12ec9d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x12ed00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ed58);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  local_130 = 0x40788a6666666666;
  format_00.data_._7_1_ = in_stack_fffffffffffff477;
  format_00.data_._0_7_ = in_stack_fffffffffffff470;
  format_00.size_ = (size_t)in_stack_fffffffffffff478;
  test_sprintf<double>(format_00,(double *)in_stack_fffffffffffff468);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [7])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               (char (*) [5])in_stack_fffffffffffff468);
    testing::AssertionResult::failure_message((AssertionResult *)0x12eeb5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x12ef18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ef70);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  format_09.data_._7_1_ = in_stack_fffffffffffff4b7;
  format_09.data_._0_7_ = in_stack_fffffffffffff4b0;
  format_09.size_ = in_stack_fffffffffffff4b8;
  make_positional_abi_cxx11_(format_09);
  local_1a8 = 0x40788a6666666666;
  fmt::v5::sprintf<std::__cxx11::string,double>
            (in_stack_fffffffffffff4a8,(double *)in_stack_fffffffffffff4a0);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [7])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12f0d8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x12f13b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f193);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  local_200 = 0x40788a6666666666;
  format_01.data_._7_1_ = in_stack_fffffffffffff477;
  format_01.data_._0_7_ = in_stack_fffffffffffff470;
  format_01.size_ = (size_t)in_stack_fffffffffffff478;
  test_sprintf<double>(format_01,(double *)in_stack_fffffffffffff468);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [6])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               (char (*) [5])in_stack_fffffffffffff468);
    testing::AssertionResult::failure_message((AssertionResult *)0x12f2f0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x12f353);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f3ab);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  format_10.data_._7_1_ = in_stack_fffffffffffff4b7;
  format_10.data_._0_7_ = in_stack_fffffffffffff4b0;
  format_10.size_ = in_stack_fffffffffffff4b8;
  make_positional_abi_cxx11_(format_10);
  local_278 = 0x40788a6666666666;
  fmt::v5::sprintf<std::__cxx11::string,double>
            (in_stack_fffffffffffff4a8,(double *)in_stack_fffffffffffff4a0);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [6])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_240);
  std::__cxx11::string::~string(local_260);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12f513);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x12f576);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f5ce);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  local_2d0 = 0x40788a6666666666;
  format_02.data_._7_1_ = in_stack_fffffffffffff477;
  format_02.data_._0_7_ = in_stack_fffffffffffff470;
  format_02.size_ = (size_t)in_stack_fffffffffffff478;
  test_sprintf<double>(format_02,(double *)in_stack_fffffffffffff468);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [4])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_2b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_298);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               (char (*) [4])in_stack_fffffffffffff468);
    testing::AssertionResult::failure_message((AssertionResult *)0x12f72b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x12f78e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12f7e6);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  format_11.data_._7_1_ = in_stack_fffffffffffff4b7;
  format_11.data_._0_7_ = in_stack_fffffffffffff4b0;
  format_11.size_ = in_stack_fffffffffffff4b8;
  make_positional_abi_cxx11_(format_11);
  local_348 = 0x40788a6666666666;
  fmt::v5::sprintf<std::__cxx11::string,double>
            (in_stack_fffffffffffff4a8,(double *)in_stack_fffffffffffff4a0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [4])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_310);
  std::__cxx11::string::~string(local_330);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12f94e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x12f9b1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12fa09);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  local_3a0 = 0x40788a6666666666;
  format_03.data_._7_1_ = in_stack_fffffffffffff477;
  format_03.data_._0_7_ = in_stack_fffffffffffff470;
  format_03.size_ = (size_t)in_stack_fffffffffffff478;
  test_sprintf<double>(format_03,(double *)in_stack_fffffffffffff468);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [11])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               (char (*) [3])in_stack_fffffffffffff468);
    testing::AssertionResult::failure_message((AssertionResult *)0x12fb66);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x12fbc9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12fc21);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  format_12.data_._7_1_ = in_stack_fffffffffffff4b7;
  format_12.data_._0_7_ = in_stack_fffffffffffff4b0;
  format_12.size_ = in_stack_fffffffffffff4b8;
  make_positional_abi_cxx11_(format_12);
  local_418 = 0x40788a6666666666;
  fmt::v5::sprintf<std::__cxx11::string,double>
            (in_stack_fffffffffffff4a8,(double *)in_stack_fffffffffffff4a0);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [11])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12fd89);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x12fdec);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12fe44);
  safe_sprintf<256ul>((char (*) [256])0x40788a6666666666);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  local_570 = 0x40788a6666666666;
  format_04.data_._7_1_ = in_stack_fffffffffffff477;
  format_04.data_._0_7_ = in_stack_fffffffffffff470;
  format_04.size_ = (size_t)in_stack_fffffffffffff478;
  test_sprintf<double>(format_04,(double *)in_stack_fffffffffffff468);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_558);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_538);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               (char (*) [3])in_stack_fffffffffffff468);
    testing::AssertionResult::failure_message((AssertionResult *)0x12ffd1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x130034);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13008c);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  format_13.data_._7_1_ = in_stack_fffffffffffff4b7;
  format_13.data_._0_7_ = in_stack_fffffffffffff4b0;
  format_13.size_ = in_stack_fffffffffffff4b8;
  make_positional_abi_cxx11_(format_13);
  local_5e8 = 0x40788a6666666666;
  fmt::v5::sprintf<std::__cxx11::string,double>
            (in_stack_fffffffffffff4a8,(double *)in_stack_fffffffffffff4a0);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_5b0);
  std::__cxx11::string::~string(local_5d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_590);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1301f5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x130258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1302b0);
  safe_sprintf<256ul>((char (*) [256])0x40788a6666666666);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  local_640 = 0x40788a6666666666;
  format_05.data_._7_1_ = in_stack_fffffffffffff477;
  format_05.data_._0_7_ = in_stack_fffffffffffff470;
  format_05.size_ = (size_t)in_stack_fffffffffffff478;
  test_sprintf<double>(format_05,(double *)in_stack_fffffffffffff468);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_628);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_608);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               (char (*) [3])in_stack_fffffffffffff468);
    testing::AssertionResult::failure_message((AssertionResult *)0x13043d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x1304a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1304f8);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  format_14.data_._7_1_ = in_stack_fffffffffffff4b7;
  format_14.data_._0_7_ = in_stack_fffffffffffff4b0;
  format_14.size_ = in_stack_fffffffffffff4b8;
  make_positional_abi_cxx11_(format_14);
  local_6b8 = 0x40788a6666666666;
  fmt::v5::sprintf<std::__cxx11::string,double>
            (in_stack_fffffffffffff4a8,(double *)in_stack_fffffffffffff4a0);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_680);
  std::__cxx11::string::~string(local_6a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_660);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::AssertionResult::failure_message((AssertionResult *)0x130661);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x1306c4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13071c);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  local_710 = 0x40788a6666666666;
  format_06.data_._7_1_ = in_stack_fffffffffffff477;
  format_06.data_._0_7_ = in_stack_fffffffffffff470;
  format_06.size_ = (size_t)in_stack_fffffffffffff478;
  test_sprintf<double>(format_06,(double *)in_stack_fffffffffffff468);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [7])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_6f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               (char (*) [3])in_stack_fffffffffffff468);
    testing::AssertionResult::failure_message((AssertionResult *)0x130879);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0),
               in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x1308dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130934);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  format_15.data_._7_1_ = in_stack_fffffffffffff4b7;
  format_15.data_._0_7_ = in_stack_fffffffffffff4b0;
  format_15.size_ = in_stack_fffffffffffff4b8;
  make_positional_abi_cxx11_(format_15);
  local_788 = 0x40788a6666666666;
  fmt::v5::sprintf<std::__cxx11::string,double>
            (in_stack_fffffffffffff4a8,(double *)in_stack_fffffffffffff4a0);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [7])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_750);
  std::__cxx11::string::~string(local_770);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_730);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    in_stack_fffffffffffff4e8 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x130a9c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff4f0),in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x130aff);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130b57);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  local_7e0 = 0x40788a6666666666;
  format_07.data_._7_1_ = in_stack_fffffffffffff477;
  format_07.data_._0_7_ = in_stack_fffffffffffff470;
  format_07.size_ = (size_t)in_stack_fffffffffffff478;
  test_sprintf<double>(format_07,(double *)in_stack_fffffffffffff468);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [7])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_7c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               in_stack_fffffffffffff468);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
               (char (*) [3])in_stack_fffffffffffff468);
    testing::AssertionResult::failure_message((AssertionResult *)0x130c9f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff4f0),in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x130cf9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130d51);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470),
             *in_stack_fffffffffffff468);
  format_16.data_._7_1_ = in_stack_fffffffffffff4b7;
  format_16.data_._0_7_ = in_stack_fffffffffffff4b0;
  format_16.size_ = (size_t)local_840;
  make_positional_abi_cxx11_(format_16);
  local_858 = 0x40788a6666666666;
  fmt::v5::sprintf<std::__cxx11::string,double>
            (in_stack_fffffffffffff4a8,(double *)in_stack_fffffffffffff4a0);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
             (char (*) [7])in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string(local_820);
  std::__cxx11::string::~string(local_840);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_800);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff4a0);
    in_stack_fffffffffffff4a8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x130ead);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff4a0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff4f0),in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x130f0a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130f62);
  format_17 = local_528;
  safe_sprintf<256ul>((char (*) [256])0xc0788a6666666666,format_17,"%a");
  TVar5 = (Type)((ulong)format_17 >> 0x20);
  local_8a0 = 0xc0788a6666666666;
  this_00 = local_898;
  fmt::v5::format<char[5],double>((char (*) [5])in_stack_fffffffffffff4a8,(double *)this_00);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff488,in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  std::__cxx11::string::~string((string *)local_898);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_878);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff488 =
         testing::AssertionResult::failure_message((AssertionResult *)0x13107b);
    testing::internal::AssertHelper::AssertHelper
              (this_00,TVar5,(char *)CONCAT17(uVar3,in_stack_fffffffffffff490),
               (int)((ulong)in_stack_fffffffffffff488 >> 0x20),in_stack_fffffffffffff480);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff4f0),in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x1310d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131130);
  expected = (char (*) [256])local_528;
  safe_sprintf<256ul>((char (*) [256])0xc0788a6666666666,(char *)expected,"%A");
  actual_expression = local_8e0;
  fmt::v5::format<char[5],double>((char (*) [5])in_stack_fffffffffffff4a8,(double *)this_00);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff488,(char *)actual_expression,expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff477,in_stack_fffffffffffff470));
  line = (int)((ulong)in_stack_fffffffffffff488 >> 0x20);
  std::__cxx11::string::~string(local_8e0);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_8c0);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x131249);
    testing::internal::AssertHelper::AssertHelper
              (this_00,TVar5,(char *)CONCAT17(uVar3,in_stack_fffffffffffff490),line,
               (char *)actual_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffff4f0),in_stack_fffffffffffff4e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff470));
    testing::Message::~Message((Message *)0x1312a4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1312f9);
  return;
}

Assistant:

TEST(PrintfTest, Float) {
  EXPECT_PRINTF("392.650000", "%f", 392.65);
  EXPECT_PRINTF("392.65", "%.2f", 392.65);
  EXPECT_PRINTF("392.6", "%.1f", 392.65);
  EXPECT_PRINTF("393", "%.f", 392.65);
  EXPECT_PRINTF("392.650000", "%F", 392.65);
  char buffer[BUFFER_SIZE];
  safe_sprintf(buffer, "%e", 392.65);
  EXPECT_PRINTF(buffer, "%e", 392.65);
  safe_sprintf(buffer, "%E", 392.65);
  EXPECT_PRINTF(buffer, "%E", 392.65);
  EXPECT_PRINTF("392.65", "%g", 392.65);
  EXPECT_PRINTF("392.65", "%G", 392.65);
  safe_sprintf(buffer, "%a", -392.65);
  EXPECT_EQ(buffer, format("{:a}", -392.65));
  safe_sprintf(buffer, "%A", -392.65);
  EXPECT_EQ(buffer, format("{:A}", -392.65));
}